

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

Expression *
slang::ast::AssignmentExpression::fromComponents
          (Compilation *compilation,optional<slang::ast::BinaryOperator> op,
          bitmask<slang::ast::AssignFlags> flags,Expression *lhs,Expression *rhs,SourceRange opRange
          ,TimingControl *timingControl,SourceRange sourceRange,ASTContext *context)

{
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange assignmentRange;
  bool bVar1;
  LValueReferenceExpression *pLVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  Symbol *pSVar5;
  ASTContext *in_RCX;
  undefined1 in_DL;
  SourceLocation in_RSI;
  Expression *in_RDI;
  int *in_R9;
  ASTContext *unaff_retaddr;
  SourceLocation in_stack_00000008;
  bitmask<slang::ast::AssignFlags> in_stack_00000017;
  SourceLocation in_stack_00000018;
  Compilation *in_stack_00000020;
  SourceLocation in_stack_00000028;
  Type *in_stack_00000030;
  ASTContext *in_stack_00000038;
  undefined1 in_stack_00000040 [16];
  bitmask<slang::ast::AssignFlags> *in_stack_00000060;
  Symbol *sym;
  LValueReferenceExpression *lvalRef;
  AssignmentExpression *result;
  ASTContext *in_stack_000001d0;
  BinaryOperator in_stack_000001dc;
  Expression *in_stack_000001e0;
  Expression *in_stack_000001e8;
  undefined1 in_stack_000001f0 [16];
  SourceRange in_stack_00000210;
  bitmask<slang::ast::AssignFlags> *in_stack_fffffffffffffe98;
  bitmask<slang::ast::AssignFlags> *in_stack_fffffffffffffea0;
  Compilation *compilation_00;
  SourceRange *in_stack_fffffffffffffeb0;
  Type *in_stack_fffffffffffffeb8;
  BumpAllocator *in_stack_fffffffffffffec0;
  SourceLocation SVar6;
  Expression *in_stack_fffffffffffffec8;
  SourceLocation SVar7;
  Expression *in_stack_fffffffffffffed0;
  DiagCode code;
  Type *in_stack_fffffffffffffed8;
  bool *in_stack_fffffffffffffee0;
  undefined1 allowPacked;
  Expression *in_stack_fffffffffffffee8;
  SyntaxNode *in_stack_fffffffffffffef0;
  SourceRange *this;
  bitmask<slang::ast::AssignFlags> local_42;
  undefined1 local_41;
  AssignmentExpression *local_40;
  int *local_38;
  undefined7 in_stack_ffffffffffffffe8;
  SourceLocation in_stack_fffffffffffffff8;
  
  compilation_00 = (Compilation *)&stack0x00000018;
  this = (SourceRange *)&stack0x00000008;
  local_38 = in_R9;
  pEVar4 = in_RDI;
  bitmask<slang::ast::AssignFlags>::bitmask(&local_42,NonBlocking);
  local_41 = bitmask<slang::ast::AssignFlags>::has
                       (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x9e1728);
  pEVar3 = (Expression *)&local_38;
  local_40 = BumpAllocator::
             emplace<slang::ast::AssignmentExpression,std::optional<slang::ast::BinaryOperator>&,bool,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::TimingControl_const*&,slang::SourceRange&>
                       ((BumpAllocator *)in_stack_fffffffffffffef0,
                        (optional<slang::ast::BinaryOperator> *)in_stack_fffffffffffffee8,
                        in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                        in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(TimingControl **)this,
                        (SourceRange *)in_RDI);
  allowPacked = (undefined1)((ulong)in_stack_fffffffffffffee0 >> 0x38);
  bVar1 = Expression::bad((Expression *)compilation_00);
  if ((bVar1) || (bVar1 = Expression::bad((Expression *)compilation_00), bVar1)) {
    local_40 = (AssignmentExpression *)Expression::badExpr(compilation_00,pEVar3);
  }
  else if (*(ExpressionKind *)&(in_RCX->scope).ptr == Streaming) {
    Expression::as<slang::ast::StreamingConcatenationExpression>((Expression *)in_RCX);
    assignmentRange.endLoc = in_stack_fffffffffffffff8;
    assignmentRange.startLoc = in_RSI;
    bVar1 = Bitstream::canBeTarget
                      ((StreamingConcatenationExpression *)CONCAT17(in_DL,in_stack_ffffffffffffffe8)
                       ,pEVar4,assignmentRange,in_RCX);
    if (bVar1) {
      SourceRange::start(this);
      bVar1 = Expression::requireLValue
                        ((Expression *)in_stack_00000008,unaff_retaddr,in_stack_00000018,
                         in_stack_00000017,(Expression *)in_stack_fffffffffffffff8);
      if (!bVar1) {
        local_40 = (AssignmentExpression *)Expression::badExpr(compilation_00,pEVar3);
      }
    }
    else {
      local_40 = (AssignmentExpression *)Expression::badExpr(compilation_00,pEVar3);
    }
  }
  else {
    bVar1 = std::optional::operator_cast_to_bool((optional<slang::ast::BinaryOperator> *)0x9e18e7);
    if (bVar1) {
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x9e190e);
      pLVar2 = BumpAllocator::
               emplace<slang::ast::LValueReferenceExpression,slang::ast::Type_const&,slang::SourceRange&>
                         (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                          in_stack_fffffffffffffeb0);
      allowPacked = (undefined1)((ulong)pLVar2 >> 0x38);
      in_stack_fffffffffffffee8 = local_40->right_;
      std::optional<slang::ast::BinaryOperator>::operator*
                ((optional<slang::ast::BinaryOperator> *)0x9e195a);
      compilation_00 = in_stack_00000020;
      pEVar3 = BinaryExpression::fromComponents
                         (in_stack_000001e8,in_stack_000001e0,in_stack_000001dc,
                          (SourceRange)in_stack_000001f0,in_stack_00000210,in_stack_000001d0);
      local_40->right_ = pEVar3;
    }
    SVar6 = in_stack_00000028;
    not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x9e1a03);
    code = SVar6._4_4_;
    pEVar3 = (Expression *)&stack0xffffffffffffffef;
    pEVar4 = Expression::convertAssignment
                       (in_stack_00000038,in_stack_00000030,(Expression *)in_stack_00000028,
                        (SourceRange)in_stack_00000040,(Expression **)in_stack_00000020,
                        in_stack_00000060);
    local_40->right_ = pEVar4;
    bVar1 = Expression::bad((Expression *)compilation_00);
    if (bVar1) {
      local_40 = (AssignmentExpression *)Expression::badExpr(compilation_00,pEVar3);
    }
    else {
      SVar6 = (SourceLocation)local_40->left_;
      SVar7 = in_stack_00000028;
      SourceRange::start(this);
      bVar1 = Expression::requireLValue
                        ((Expression *)in_stack_00000008,unaff_retaddr,in_stack_00000018,
                         in_stack_00000017,(Expression *)in_stack_fffffffffffffff8);
      if (bVar1) {
        if (local_38 != (int *)0x0) {
          pSVar5 = Expression::getSymbolReference(in_stack_fffffffffffffee8,(bool)allowPacked);
          if ((pSVar5 == (Symbol *)0x0) || (pSVar5->kind != ClockVar)) {
            if (*local_38 == 8) {
              slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffef0);
              sourceRange_01.endLoc = SVar7;
              sourceRange_01.startLoc = SVar6;
              ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffeb8,code,sourceRange_01);
            }
          }
          else if (*local_38 != 8) {
            slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffef0);
            sourceRange_00.endLoc = SVar7;
            sourceRange_00.startLoc = SVar6;
            ASTContext::addDiag((ASTContext *)in_stack_00000028,code,sourceRange_00);
          }
        }
      }
      else {
        local_40 = (AssignmentExpression *)Expression::badExpr(compilation_00,pEVar3);
      }
    }
  }
  return &local_40->super_Expression;
}

Assistant:

Expression& AssignmentExpression::fromComponents(
    Compilation& compilation, std::optional<BinaryOperator> op, bitmask<AssignFlags> flags,
    Expression& lhs, Expression& rhs, SourceRange opRange, const TimingControl* timingControl,
    SourceRange sourceRange, const ASTContext& context) {

    auto result = compilation.emplace<AssignmentExpression>(op, flags.has(AssignFlags::NonBlocking),
                                                            *lhs.type, lhs, rhs, timingControl,
                                                            sourceRange);

    if (lhs.bad() || rhs.bad())
        return badExpr(compilation, result);

    if (lhs.kind == ExpressionKind::Streaming) {
        if (!Bitstream::canBeTarget(lhs.as<StreamingConcatenationExpression>(), rhs, opRange,
                                    context)) {
            return badExpr(compilation, result);
        }

        if (!lhs.requireLValue(context, opRange.start(), flags))
            return badExpr(compilation, result);

        return *result;
    }

    // If this is a compound assignment operator create a binary expression that will
    // apply the operator for us on the right hand side.
    if (op) {
        auto lvalRef = compilation.emplace<LValueReferenceExpression>(*lhs.type, lhs.sourceRange);
        result->right_ = &BinaryExpression::fromComponents(*lvalRef, *result->right_, *op, opRange,
                                                           sourceRange, context);
    }

    result->right_ = &convertAssignment(context, *lhs.type, *result->right_, opRange,
                                        &result->left_, &flags);
    if (result->right_->bad())
        return badExpr(compilation, result);

    if (!result->left_->requireLValue(context, opRange.start(), flags))
        return badExpr(compilation, result);

    if (timingControl) {
        // Cycle delays are only allowed on clock vars, and clock vars
        // cannot use any timing control other than cycle delays.
        if (auto sym = lhs.getSymbolReference(); sym && sym->kind == SymbolKind::ClockVar) {
            if (timingControl->kind != TimingControlKind::CycleDelay) {
                SLANG_ASSERT(timingControl->syntax);
                context.addDiag(diag::ClockVarBadTiming, timingControl->syntax->sourceRange());
            }
        }
        else if (timingControl->kind == TimingControlKind::CycleDelay) {
            SLANG_ASSERT(timingControl->syntax);
            context.addDiag(diag::CycleDelayNonClock, timingControl->syntax->sourceRange());
        }
    }

    return *result;
}